

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(xpath_stack_data *this)

{
  xpath_memory_block *pxVar1;
  xpath_memory_block *next_1;
  xpath_memory_block *pxVar2;
  xpath_memory_block *next;
  
  pxVar2 = (this->result)._root;
  while (pxVar1 = pxVar2->next, pxVar1 != (xpath_memory_block *)0x0) {
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (pxVar2);
    pxVar2 = pxVar1;
  }
  pxVar2 = (this->temp)._root;
  while (pxVar1 = pxVar2->next, pxVar1 != (xpath_memory_block *)0x0) {
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (pxVar2);
    pxVar2 = pxVar1;
  }
  return;
}

Assistant:

~xpath_stack_data()
		{
			result.release();
			temp.release();
		}